

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O0

uint16_t __thiscall
SimpleParallelAnalyzer::GetWordAtLocation(SimpleParallelAnalyzer *this,uint64_t sample_number)

{
  int iVar1;
  size_type sVar2;
  reference ppAVar3;
  reference pvVar4;
  pointer pSVar5;
  int local_24;
  int i;
  int num_data_lines;
  uint16_t result;
  uint64_t sample_number_local;
  SimpleParallelAnalyzer *this_local;
  
  i._2_2_ = 0;
  sVar2 = std::vector<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>::size
                    (&this->mData);
  for (local_24 = 0; local_24 < (int)sVar2; local_24 = local_24 + 1) {
    ppAVar3 = std::vector<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>::operator[]
                        (&this->mData,(long)local_24);
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)*ppAVar3);
    std::vector<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>::operator[]
              (&this->mData,(long)local_24);
    iVar1 = AnalyzerChannelData::GetBitState();
    if (iVar1 == 1) {
      pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&this->mDataMasks,(long)local_24);
      i._2_2_ = i._2_2_ | *pvVar4;
    }
    pSVar5 = std::
             unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
             ::operator->(&this->mResults);
    std::vector<Channel,_std::allocator<Channel>_>::operator[](&this->mDataChannels,(long)local_24);
    AnalyzerResults::AddMarker((ulonglong)pSVar5,(MarkerType)sample_number,(Channel *)0x0);
  }
  return i._2_2_;
}

Assistant:

uint16_t SimpleParallelAnalyzer::GetWordAtLocation( uint64_t sample_number )
{
    uint16_t result = 0;

    int num_data_lines = mData.size();

    for( int i = 0; i < num_data_lines; i++ )
    {
        mData[ i ]->AdvanceToAbsPosition( sample_number );
        if( mData[ i ]->GetBitState() == BIT_HIGH )
        {
            result |= mDataMasks[ i ];
        }
        mResults->AddMarker( sample_number, AnalyzerResults::Dot, mDataChannels[ i ] );
    }

    return result;
}